

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O3

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::AddBranchToBlock
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *parent_block,
          uint32_t branch_destination)

{
  InstructionBuilder builder;
  InstructionBuilder local_20;
  
  local_20.context_ = (this->super_Pass).context_;
  local_20.preserved_analyses_ =
       (uint)(anonymous_namespace)::kAnalysisDefUseAndInstrToBlockMapping * 3;
  local_20.insert_before_.super_iterator.node_ =
       (iterator)&(parent_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  local_20.parent_ = parent_block;
  InstructionBuilder::AddBranch(&local_20,branch_destination);
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::AddBranchToBlock(
    BasicBlock* parent_block, uint32_t branch_destination) const {
  InstructionBuilder builder{context(), parent_block,
                             kAnalysisDefUseAndInstrToBlockMapping};
  builder.AddBranch(branch_destination);
}